

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::TSPI_PDU::SetSystemSpecificData(TSPI_PDU *this,KOCTET *Data,KUINT8 Length)

{
  KUINT16 *pKVar1;
  pointer pcVar2;
  ulong uVar3;
  bool bVar4;
  
  ClearSystemSpecificData(this);
  SetSystemSpecificDataFlag(this,true);
  pcVar2 = (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish != pcVar2) {
    (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar2;
  }
  uVar3 = (ulong)Length;
  while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
    std::vector<char,_std::allocator<char>_>::push_back(&this->m_vSSD,Data);
    Data = Data + 1;
  }
  this->m_ui8SSDLen = Length;
  pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + (ushort)Length;
  return;
}

Assistant:

void TSPI_PDU::SetSystemSpecificData( const KOCTET * Data, KUINT8 Length )
{
    ClearSystemSpecificData();
    SetSystemSpecificDataFlag( true );
    m_vSSD.clear();

    for( KUINT8 i = 0; i < Length; ++i )
    {
        m_vSSD.push_back( Data[i] );
    }

    m_ui8SSDLen = Length;

    // Set the new pdu length
    m_ui16PDULength += Length;
}